

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

int __thiscall
unodb::detail::
olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::init(olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
       *this,EVP_PKEY_CTX *ctx)

{
  atomic_version_type *this_00;
  int iVar1;
  pthread_t pVar2;
  write_guard *in_RCX;
  optimistic_lock *in_RDX;
  long *in_R9;
  
  if (in_RCX->lock != in_RDX) {
    __assert_fail("source_node_guard.guards(lock(source_node))",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x52e,
                  "void unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_48_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  if (*in_R9 == 0) {
    __assert_fail("child_guard.active()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x52f,
                  "void unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_48_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  obsolete<unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
            ((olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)in_RDX,in_RCX);
  this_00 = (atomic_version_type *)*in_R9;
  optimistic_lock::atomic_version_type::write_unlock_and_obsolete(this_00);
  pVar2 = pthread_self();
  this_00[2].version.super___atomic_base<unsigned_long>._M_i = pVar2;
  *in_R9 = 0;
  iVar1 = basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::init(&this->
                  super_olc_inode_16_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                 ,ctx);
  if (in_RCX->lock != (optimistic_lock *)0x0) {
    __assert_fail("!source_node_guard.active()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x534,
                  "void unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_48_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  if (*in_R9 == 0) {
    return iVar1;
  }
  __assert_fail("!child_guard.active()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x535,
                "void unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_48_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

void olc_inode_16<Key, Value>::init(
    db_type& db_instance, inode_48_type& source_node,
    unodb::optimistic_lock::write_guard& source_node_guard,
    std::uint8_t child_to_delete,
    unodb::optimistic_lock::write_guard& child_guard) noexcept {
  UNODB_DETAIL_ASSERT(source_node_guard.guards(lock(source_node)));
  UNODB_DETAIL_ASSERT(child_guard.active());

  parent_class::init(db_instance, obsolete(source_node, source_node_guard),
                     obsolete_child_by_index(child_to_delete, child_guard));

  UNODB_DETAIL_ASSERT(!source_node_guard.active());
  UNODB_DETAIL_ASSERT(!child_guard.active());
}